

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void rw::decompressDXT3(uint8 *adst,int32 w,int32 h,uint8 *src)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint local_bc;
  uint local_b8;
  uint32 k_2;
  uint32 l;
  int32 k_1;
  uint64 alphas;
  uint local_a0;
  int32 k;
  uint32 indices;
  uint32 col1;
  uint32 col0;
  int32 j;
  uint8 (*dst) [4];
  uint8 a [16];
  uint8 idx [16];
  uint32 c [4] [4];
  int32 y;
  int32 x;
  uint8 *src_local;
  int32 h_local;
  int32 w_local;
  uint8 *adst_local;
  
  c[3][3] = 0;
  c[3][2] = 0;
  for (col1 = 0; (int)col1 < w * h; col1 = col1 + 0x10) {
    uVar1 = *(ushort *)(src + (int)(col1 + 8));
    uVar2 = *(ushort *)(src + (int)(col1 + 10));
    uVar3 = ((uint)(uVar1 >> 0xb) * 0xff) / 0x1f;
    uVar4 = ((uVar1 >> 5 & 0x3f) * 0xff) / 0x3f;
    c[0][0] = ((uVar1 & 0x1f) * 0xff) / 0x1f;
    c[0][2] = ((uint)(uVar2 >> 0xb) * 0xff) / 0x1f;
    c[0][3] = ((uVar2 >> 5 & 0x3f) * 0xff) / 0x3f;
    c[1][0] = ((uVar2 & 0x1f) * 0xff) / 0x1f;
    c[1][2] = (uVar3 * 2 + c[0][2]) / 3;
    c[1][3] = (uVar4 * 2 + c[0][3]) / 3;
    c[2][0] = (c[0][0] * 2 + c[1][0]) / 3;
    c[2][2] = (uVar3 + c[0][2] * 2) / 3;
    c[2][3] = (uVar4 + c[0][3] * 2) / 3;
    c[3][0] = (c[0][0] + c[1][0] * 2) / 3;
    local_a0 = *(uint *)(src + (int)(col1 + 0xc));
    for (alphas._4_4_ = 0; alphas._4_4_ < 0x10; alphas._4_4_ = alphas._4_4_ + 1) {
      a[(long)alphas._4_4_ + 8] = (byte)local_a0 & 3;
      local_a0 = local_a0 >> 2;
    }
    _l = *(ulong *)(src + (int)col1);
    for (k_2 = 0; (int)k_2 < 0x10; k_2 = k_2 + 1) {
      a[(long)(int)k_2 + -8] = ((byte)_l & 0xf) * '\x11';
      _l = _l >> 4;
    }
    for (local_b8 = 0; local_b8 < 4; local_b8 = local_b8 + 1) {
      for (local_bc = 0; local_bc < 4; local_bc = local_bc + 1) {
        adst[(ulong)((c[3][2] + local_b8) * w + c[3][3] + local_bc) * 4] =
             (uint8)c[(ulong)a[(ulong)(local_b8 * 4 + local_bc) + 8] - 1][2];
        adst[(ulong)((c[3][2] + local_b8) * w + c[3][3] + local_bc) * 4 + 1] =
             (uint8)c[(ulong)a[(ulong)(local_b8 * 4 + local_bc) + 8] - 1][3];
        adst[(ulong)((c[3][2] + local_b8) * w + c[3][3] + local_bc) * 4 + 2] =
             (uint8)c[a[(ulong)(local_b8 * 4 + local_bc) + 8]][0];
        adst[(ulong)((c[3][2] + local_b8) * w + c[3][3] + local_bc) * 4 + 3] =
             a[(ulong)(local_b8 * 4 + local_bc) - 8];
      }
    }
    c[3][3] = c[3][3] + 4;
    if (w <= (int)c[3][3]) {
      c[3][2] = c[3][2] + 4;
      c[3][3] = 0;
    }
  }
  return;
}

Assistant:

void
decompressDXT3(uint8 *adst, int32 w, int32 h, uint8 *src)
{
	/* j loops through old texels
	 * x and y loop through new texels */
	int32 x = 0, y = 0;
	uint32 c[4][4];
	uint8 idx[16];
	uint8 a[16];
	uint8 (*dst)[4] = (uint8(*)[4])adst;
	for(int32 j = 0; j < w*h; j += 16){
		/* calculate colors */
		uint32 col0 = *((uint16*)&src[j+8]);
		uint32 col1 = *((uint16*)&src[j+10]);
		c[0][0] = ((col0>>11) & 0x1F)*0xFF/0x1F;
		c[0][1] = ((col0>> 5) & 0x3F)*0xFF/0x3F;
		c[0][2] = ( col0      & 0x1F)*0xFF/0x1F;

		c[1][0] = ((col1>>11) & 0x1F)*0xFF/0x1F;
		c[1][1] = ((col1>> 5) & 0x3F)*0xFF/0x3F;
		c[1][2] = ( col1      & 0x1F)*0xFF/0x1F;

		c[2][0] = (2*c[0][0] + 1*c[1][0])/3;
		c[2][1] = (2*c[0][1] + 1*c[1][1])/3;
		c[2][2] = (2*c[0][2] + 1*c[1][2])/3;

		c[3][0] = (1*c[0][0] + 2*c[1][0])/3;
		c[3][1] = (1*c[0][1] + 2*c[1][1])/3;
		c[3][2] = (1*c[0][2] + 2*c[1][2])/3;

		/* make index list */
		uint32 indices = *((uint32*)&src[j+12]);
		for(int32 k = 0; k < 16; k++){
			idx[k] = indices & 0x3;
			indices >>= 2;
		}
		uint64 alphas = *((uint64*)&src[j+0]);
		for(int32 k = 0; k < 16; k++){
			a[k] = (alphas & 0xF)*17;
			alphas >>= 4;
		}

		/* write bytes */
		for(uint32 l = 0; l < 4; l++)
			for(uint32 k = 0; k < 4; k++){
				dst[(y+l)*w + x+k][0] = c[idx[l*4+k]][0];
				dst[(y+l)*w + x+k][1] = c[idx[l*4+k]][1];
				dst[(y+l)*w + x+k][2] = c[idx[l*4+k]][2];
				dst[(y+l)*w + x+k][3] = a[l*4+k];
			}
		x += 4;
		if(x >= w){
			y += 4;
			x = 0;
		}
	}
}